

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O0

void workOnRGBE(RGBE *scan,int len,float *cols)

{
  int expo_00;
  float *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar1;
  int expo;
  int in_stack_ffffffffffffffe0;
  float *local_18;
  int local_c;
  long local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while (0 < local_c) {
    expo_00 = *(byte *)(local_8 + 3) - 0x80;
    fVar1 = convertComponent(expo_00,in_stack_ffffffffffffffe0);
    *local_18 = fVar1;
    fVar1 = convertComponent(expo_00,in_stack_ffffffffffffffe0);
    local_18[1] = fVar1;
    fVar1 = convertComponent(expo_00,in_stack_ffffffffffffffe0);
    local_18[2] = fVar1;
    local_18 = local_18 + 3;
    local_8 = local_8 + 4;
    local_c = local_c + -1;
  }
  return;
}

Assistant:

void workOnRGBE(RGBE *scan, int len, float *cols)
{
	while (len-- > 0) {
		int expo = scan[0][E] - 128;
		cols[0] = convertComponent(expo, scan[0][R]);
		cols[1] = convertComponent(expo, scan[0][G]);
		cols[2] = convertComponent(expo, scan[0][B]);
		cols += 3;
		scan++;
	}
}